

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInter.c
# Opt level: O2

Sto_Cls_t * Int_ManPropagate(Int_Man_t *p,int Start)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  abctime aVar6;
  abctime aVar8;
  long lVar9;
  long lVar10;
  Sto_Cls_t **ppSVar11;
  ulong uVar12;
  uint uVar13;
  Sto_Cls_t *pClause;
  undefined1 auVar14 [16];
  ulong uVar7;
  
  aVar6 = Abc_Clock();
  lVar9 = (long)Start;
  do {
    if (p->nTrailSize <= lVar9) {
      pClause = (Sto_Cls_t *)0x0;
LAB_0040f9d3:
      aVar8 = Abc_Clock();
      p->timeBcp = p->timeBcp + (aVar8 - aVar6);
      return pClause;
    }
    uVar13 = p->pTrail[lVar9] ^ 1;
    ppSVar11 = p->pWatches + p->pTrail[lVar9];
LAB_0040f8d5:
    pClause = *ppSVar11;
    if (pClause != (Sto_Cls_t *)0x0) {
      uVar4 = *(uint *)&pClause[1].pNext;
      uVar3 = *(uint *)((long)&pClause[1].pNext + 4);
      if (uVar4 == uVar13) {
        *(uint *)&pClause[1].pNext = uVar3;
        *(uint *)((long)&pClause[1].pNext + 4) = uVar13;
        uVar1 = pClause->pNext0;
        uVar2 = pClause->pNext1;
        auVar14._8_4_ = (int)uVar1;
        auVar14._0_8_ = uVar2;
        auVar14._12_4_ = (int)((ulong)uVar1 >> 0x20);
        pClause->pNext0 = (Sto_Cls_t *)uVar2;
        pClause->pNext1 = (Sto_Cls_t *)auVar14._8_8_;
        uVar4 = uVar3;
      }
      else if (uVar3 != uVar13) {
        __assert_fail("pCur->pLits[1] == LitF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satInter.c"
                      ,0x1e3,"Sto_Cls_t *Int_ManPropagateOne(Int_Man_t *, lit)");
      }
      if (uVar4 != p->pAssigns[(int)uVar4 >> 1]) break;
      goto LAB_0040f9b7;
    }
    lVar9 = lVar9 + 1;
  } while( true );
  uVar4 = *(uint *)&pClause->field_0x1c >> 3 & 0xffffff;
  uVar7 = (ulong)uVar4;
  lVar10 = 10;
  uVar12 = 2;
  if (2 < uVar7) {
    uVar12 = uVar7;
  }
  for (; lVar10 - 8U < uVar7; lVar10 = lVar10 + 1) {
    uVar3 = *(uint *)((long)&pClause->pNext + lVar10 * 4);
    if ((p->pAssigns[(int)uVar3 >> 1] ^ uVar3) != 1) {
      *(uint *)((long)&pClause[1].pNext + 4) = uVar3;
      *(uint *)((long)&pClause->pNext + lVar10 * 4) = uVar13;
      *ppSVar11 = pClause->pNext1;
      Int_ManWatchClause(p,pClause,*(lit *)((long)&pClause[1].pNext + 4));
      uVar4 = *(uint *)&pClause->field_0x1c >> 3 & 0xffffff;
      uVar12 = lVar10 - 8U;
      break;
    }
  }
  if (uVar4 <= (uint)uVar12) {
    iVar5 = Int_ManEnqueue(p,*(lit *)&pClause[1].pNext,pClause);
    if (iVar5 == 0) goto LAB_0040f9d3;
LAB_0040f9b7:
    ppSVar11 = &pClause->pNext1;
  }
  goto LAB_0040f8d5;
}

Assistant:

Sto_Cls_t * Int_ManPropagate( Int_Man_t * p, int Start )
{
    Sto_Cls_t * pClause;
    int i;
    abctime clk = Abc_Clock();
    for ( i = Start; i < p->nTrailSize; i++ )
    {
        pClause = Int_ManPropagateOne( p, p->pTrail[i] );
        if ( pClause )
        {
p->timeBcp += Abc_Clock() - clk;
            return pClause;
        }
    }
p->timeBcp += Abc_Clock() - clk;
    return NULL;
}